

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O1

bool vk::checkAndLog(TestLog *log,AllocationCallbackValidationResults *results,
                    deUint32 allowedLiveAllocScopeBits)

{
  ostringstream *poVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int scopeNdx;
  pointer pAVar6;
  long lVar7;
  long lVar8;
  undefined1 local_1b0 [384];
  
  if ((results->violations).
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (results->violations).
      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((results->violations).
        super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (results->violations).
        super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar7 = 0;
      uVar5 = 0;
      do {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"VIOLATION ",10);
        uVar5 = uVar5 + 1;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
        operator<<((ostream *)poVar1,
                   (AllocationCallbackViolation *)
                   ((long)&(((results->violations).
                             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                             ._M_impl.super__Vector_impl_data._M_start)->record).type + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
        operator<<((ostream *)poVar1,
                   (AllocationCallbackRecord *)
                   ((long)&(((results->violations).
                             super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                             ._M_impl.super__Vector_impl_data._M_start)->record).type + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        lVar7 = lVar7 + 0x38;
      } while (uVar5 < (ulong)(((long)(results->violations).
                                      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(results->violations).
                                      super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x6db6db6db6db6db7));
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: Found ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," invalid allocation callbacks!",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  pAVar6 = (results->liveAllocations).
           super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((results->liveAllocations).
      super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
      ._M_impl.super__Vector_impl_data._M_finish == pAVar6) {
    lVar7 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar8 = 0;
    uVar5 = 0;
    lVar7 = 0;
    do {
      iVar2 = *(int *)((long)&pAVar6->type + lVar8);
      if (iVar2 == 0) {
        lVar4 = 0x18;
LAB_00a0e167:
        uVar3 = *(uint *)((long)&pAVar6->type + lVar8 + lVar4);
      }
      else {
        uVar3 = 5;
        if (iVar2 == 1) {
          lVar4 = 0x20;
          goto LAB_00a0e167;
        }
      }
      if ((allowedLiveAllocScopeBits >> (uVar3 & 0x1f) & 1) == 0) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"LEAK ",5);
        lVar7 = lVar7 + 1;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
        operator<<((ostream *)poVar1,(AllocationCallbackRecord *)((long)&pAVar6->type + lVar8));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      }
      uVar5 = uVar5 + 1;
      pAVar6 = (results->liveAllocations).
               super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x30;
    } while (uVar5 < (ulong)(((long)(results->liveAllocations).
                                    super__Vector_base<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4)
                            * -0x5555555555555555));
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  lVar8 = 0;
  do {
    if (results->internalAllocationTotal[0][lVar8] != 0 &&
        (allowedLiveAllocScopeBits >> ((uint)lVar8 & 0x1f) & 1) == 0) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"LEAK ",5);
      lVar7 = lVar7 + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes of (",0xb);
      std::ostream::operator<<(poVar1,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,(uint)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,") internal memory is still allocated",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  if (lVar7 != 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: Found ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," memory leaks!",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  return lVar7 == 0 &&
         (results->violations).
         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (results->violations).
         super__Vector_base<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool checkAndLog (tcu::TestLog& log, const AllocationCallbackValidationResults& results, deUint32 allowedLiveAllocScopeBits)
{
	using tcu::TestLog;

	size_t	numLeaks	= 0;

	if (!results.violations.empty())
	{
		for (size_t violationNdx = 0; violationNdx < results.violations.size(); ++violationNdx)
		{
			log << TestLog::Message << "VIOLATION " << (violationNdx+1)
													<< ": " << results.violations[violationNdx]
													<< " (" << results.violations[violationNdx].record << ")"
				<< TestLog::EndMessage;
		}

		log << TestLog::Message << "ERROR: Found " << results.violations.size() << " invalid allocation callbacks!" << TestLog::EndMessage;
	}

	// Verify live allocations
	for (size_t liveNdx = 0; liveNdx < results.liveAllocations.size(); ++liveNdx)
	{
		const AllocationCallbackRecord&		record	= results.liveAllocations[liveNdx];
		const VkSystemAllocationScope		scope	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION		? record.data.allocation.scope
													: record.type == AllocationCallbackRecord::TYPE_REALLOCATION	? record.data.reallocation.scope
													: VK_SYSTEM_ALLOCATION_SCOPE_LAST;

		DE_ASSERT(de::inBounds(scope, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST));

		if ((allowedLiveAllocScopeBits & (1u << scope)) == 0)
		{
			log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << record << TestLog::EndMessage;
			numLeaks += 1;
		}
	}

	// Verify internal allocations
	for (int internalAllocTypeNdx = 0; internalAllocTypeNdx < VK_INTERNAL_ALLOCATION_TYPE_LAST; ++internalAllocTypeNdx)
	{
		for (int scopeNdx = 0; scopeNdx < VK_SYSTEM_ALLOCATION_SCOPE_LAST; ++scopeNdx)
		{
			const VkInternalAllocationType	type			= (VkInternalAllocationType)internalAllocTypeNdx;
			const VkSystemAllocationScope	scope			= (VkSystemAllocationScope)scopeNdx;
			const size_t					totalAllocated	= results.internalAllocationTotal[type][scope];

			if ((allowedLiveAllocScopeBits & (1u << scopeNdx)) == 0 &&
				totalAllocated > 0)
			{
				log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << totalAllocated
										<< " bytes of (" << type << ", " << scope << ") internal memory is still allocated"
					<< TestLog::EndMessage;
				numLeaks += 1;
			}
		}
	}

	if (numLeaks > 0)
		log << TestLog::Message << "ERROR: Found " << numLeaks << " memory leaks!" << TestLog::EndMessage;

	return results.violations.empty() && numLeaks == 0;
}